

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

void my_output_message(j_common_ptr cinfo)

{
  bool bVar1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  char buffer [200];
  QLoggingCategory *in_stack_fffffffffffffee8;
  char *in_stack_fffffffffffffef8;
  QMessageLogger *in_stack_ffffffffffffff00;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_d8,0xaa,200);
  (*(code *)in_RDI->category[1].d)(in_RDI,local_d8);
  local_e8 = 0xaaaaaaaaaaaaaaaa;
  local_e0 = 0xaa;
  uStack_df = 0xaaaaaaaaaaaaaa;
  lcJpeg();
  anon_unknown.dwarf_31195::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_RDI,in_stack_fffffffffffffee8);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_e8);
    if (!bVar1) break;
    anon_unknown.dwarf_31195::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x106e21);
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_fffffffffffffee8,(char *)0x106e37);
    QMessageLogger::warning(&stack0xfffffffffffffef8,"%s",local_d8);
    local_e0 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void my_output_message(j_common_ptr cinfo)
{
    char buffer[JMSG_LENGTH_MAX];
    (*cinfo->err->format_message)(cinfo, buffer);
    qCWarning(lcJpeg,"%s", buffer);
}